

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlAttrValueSpec::FixGlyphAttrsInRules
          (GdlAttrValueSpec *this,GrcManager *pcman,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcInClasses,
          int irit,Symbol param_5)

{
  SymbolType SVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  SymbolType symtName;
  undefined8 local_48;
  
  SVar1 = GrcSymbolTableEntry::SymType(*(GrcSymbolTableEntry **)(in_RDI + 0x28));
  if (*(long *)(in_RDI + 0x38) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x90))(*(long **)(in_RDI + 0x38),in_RSI,in_RDX,in_ECX)
    ;
    if (SVar1 == ksymtFeature) {
      local_48 = *(undefined8 *)(in_RDI + 0x28);
    }
    else {
      local_48 = 0;
    }
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x70))(*(long **)(in_RDI + 0x38),0,local_48);
  }
  return;
}

Assistant:

void GdlAttrValueSpec::FixGlyphAttrsInRules(GrcManager * pcman,
	std::vector<GdlGlyphClassDefn *> & vpglfcInClasses, int irit, Symbol psymOutClass)
#endif
{
	Assert(psymOutClass->FitsSymbolType(ksymtClass) ||
		psymOutClass->FitsSymbolType(ksymtSpecialUnderscore) ||
		psymOutClass->FitsSymbolType(ksymtSpecialAt));

	SymbolType symtName = this->m_psymName->SymType();
	if (m_pexpValue)
	{
		m_pexpValue->CheckAndFixGlyphAttrsInRules(pcman, vpglfcInClasses, irit);
		m_pexpValue->LookupExpCheck(false, ((symtName == ksymtFeature) ? m_psymName : NULL));
	}
}